

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void dg::vr::RelationsAnalyzer::relateBounds
               (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
               Handle placeholder)

{
  ConstantInt **in_RDX;
  Bucket *in_RSI;
  ValueRelations *in_RDI;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar1;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar2;
  _Base_bitset<1UL> unaff_retaddr;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> unsignedLowerBound;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> signedLowerBound;
  undefined8 local_40;
  undefined8 local_30;
  
  pVar1 = getBoundOnPointedToValue
                    ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                      *)signedLowerBound.second.bits.super__Base_bitset<1UL>._M_w,
                     (VectorSet<const_llvm::Value_*> *)signedLowerBound.first,
                     unsignedLowerBound.second.bits.super__Base_bitset<1UL>._M_w._4_4_);
  pVar2 = getBoundOnPointedToValue
                    ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                      *)signedLowerBound.second.bits.super__Base_bitset<1UL>._M_w,
                     (VectorSet<const_llvm::Value_*> *)signedLowerBound.first,
                     unsignedLowerBound.second.bits.super__Base_bitset<1UL>._M_w._4_4_);
  local_30 = pVar1.first;
  if (local_30 != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (in_RDI,in_RSI,(Relations)unaff_retaddr._M_w,in_RDX);
  }
  local_40 = pVar2.first;
  if (local_40 != (ConstantInt *)0x0) {
    ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (in_RDI,in_RSI,(Relations)unaff_retaddr._M_w,in_RDX);
  }
  return;
}

Assistant:

void RelationsAnalyzer::relateBounds(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    auto signedLowerBound =
            getBoundOnPointedToValue(changeLocations, froms, Relation::SGE);
    auto unsignedLowerBound = getBoundOnPointedToValue(
            changeLocations, froms,
            Relation::UGE); // TODO collect upper bound too

    if (signedLowerBound.first)
        newGraph.set(placeholder, signedLowerBound.second,
                     signedLowerBound.first);

    if (unsignedLowerBound.first)
        newGraph.set(placeholder, unsignedLowerBound.second,
                     unsignedLowerBound.first);
}